

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1785d::IDLTypeIdentifierVisitor::visit_
          (IDLTypeIdentifierVisitor *this,Pointer *type)

{
  Type *type_;
  UnsupportedType *this_00;
  allocator local_39;
  string local_38;
  Type *local_18;
  Pointer *type_local;
  IDLTypeIdentifierVisitor *this_local;
  
  local_18 = (Type *)type;
  type_local = (Pointer *)this;
  this_00 = (UnsupportedType *)__cxa_allocate_exception(0x38);
  type_ = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_38,"pointer types are not supported for export in IDL",&local_39);
  Typelib::UnsupportedType::UnsupportedType(this_00,type_,&local_38);
  __cxa_throw(this_00,&Typelib::UnsupportedType::typeinfo,Typelib::UnsupportedType::~UnsupportedType
             );
}

Assistant:

bool IDLTypeIdentifierVisitor::visit_(Pointer const& type)
    { throw UnsupportedType(type, "pointer types are not supported for export in IDL"); }